

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O0

void crnlib::dxt_hc::determine_color_endpoints::Node::sort_task(uint64 data,void *ptr)

{
  pair<crnlib::vec<6U,_float>,_unsigned_int> *in_RDI;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *unaff_retaddr;
  
  std::sort<std::pair<crnlib::vec<6u,float>,unsigned_int>*>(unaff_retaddr,in_RDI);
  return;
}

Assistant:

static void sort_task(uint64 data, void* ptr) { std::sort(((Node*)ptr)->p, ((Node*)ptr)->pEnd); }